

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

void Omega_h::add_into<double>
               (Read<signed_char> *a_data,LOs *a2b,Write<signed_char> *b_data,Int width)

{
  undefined1 local_a0 [8];
  type f;
  LO na;
  Int width_local;
  Write<signed_char> *b_data_local;
  LOs *a2b_local;
  Read<signed_char> *a_data_local;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(a2b->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a2b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a2b->write_).shared_alloc_.alloc >> 3;
  }
  f.a_data.write_.shared_alloc_.direct_ptr._0_4_ = (int)(local_10 >> 2);
  if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((a_data->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(a_data->write_).shared_alloc_.alloc >> 3;
  }
  f.a_data.write_.shared_alloc_.direct_ptr._4_4_ = width;
  if ((int)(local_20 >> 3) == (int)f.a_data.write_.shared_alloc_.direct_ptr * width) {
    Read<int>::Read((Read<int> *)local_a0,a2b);
    f.a2b.write_.shared_alloc_.direct_ptr._0_4_ = f.a_data.write_.shared_alloc_.direct_ptr._4_4_;
    Write<double>::Write((Write<double> *)&f.width,(Write<double> *)b_data);
    Read<double>::Read((Read<double> *)&f.b_data.shared_alloc_.direct_ptr,(Read<double> *)a_data);
    parallel_for<Omega_h::add_into<double>(Omega_h::Read<double>,Omega_h::Read<int>,Omega_h::Write<double>,int)::_lambda(int)_1_>
              ((int)f.a_data.write_.shared_alloc_.direct_ptr,(type *)local_a0,"add_into");
    add_into<double>(Omega_h::Read<double>,Omega_h::Read<int>,Omega_h::Write<double>,int)::
    {lambda(int)#1}::~Write((_lambda_int__1_ *)local_a0);
    return;
  }
  fail("assertion %s failed at %s +%d\n","a_data.size() == na * width",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0xf);
}

Assistant:

void add_into(Read<T> a_data, LOs a2b, Write<T> b_data, Int width) {
  auto na = a2b.size();
  OMEGA_H_CHECK(a_data.size() == na * width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a2b[a];
    for (Int j = 0; j < width; ++j) {
      b_data[b * width + j] += a_data[a * width + j];
    }
  };
  parallel_for(na, f, "add_into");
}